

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall QAbstractSpinBox::keyPressEvent(QAbstractSpinBox *this,QKeyEvent *event)

{
  long lVar1;
  QAbstractSpinBoxPrivate *this_00;
  long lVar2;
  bool bVar3;
  char cVar4;
  Int IVar5;
  int iVar6;
  KeyboardModifier KVar7;
  int iVar8;
  uint uVar9;
  QStyle *pQVar10;
  QLineEdit *this_01;
  long in_FS_OFFSET;
  bool up;
  QLatin1StringView local_88;
  QAccessibleValueChangeEvent event_1;
  undefined1 *local_68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  IVar5 = QKeyEvent::modifiers();
  (this_00->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i = IVar5;
  _event_1 = *(Data **)(event + 0x28);
  local_68 = *(undefined1 **)(event + 0x38);
  if (_event_1 != (Data *)0x0) {
    LOCK();
    (_event_1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (_event_1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_68 == (undefined1 *)0x0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&event_1);
  }
  else {
    iVar6 = QLineEdit::cursorPosition(this_00->edit);
    lVar2 = (this_00->prefix).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&event_1);
    if (iVar6 < lVar2) {
      QLineEdit::setCursorPosition(this_00->edit,(int)(this_00->prefix).d.size);
    }
  }
  iVar6 = *(int *)(event + 0x40);
  switch(iVar6) {
  case 0x1000004:
  case 0x1000005:
    lVar2 = *(long *)(*(long *)&(this_00->edit->super_QWidget).field_0x8 + 600);
    if (*(long *)(lVar2 + 0x100) != *(long *)(lVar2 + 0xf8)) {
      *(long *)(lVar2 + 0x100) = *(long *)(lVar2 + 0xf8);
    }
    *(undefined8 *)(lVar2 + 0xf0) = 0;
    (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xd0))
              (this_00,*(uint *)&this_00->field_0x3d0 >> 6 & 1);
    selectAll(this);
    event[0xc] = (QKeyEvent)0x0;
    editingFinished(this);
    returnPressed(this);
    QLineEdit::returnPressed(this_00->edit);
    goto LAB_0043f39d;
  case 0x1000006:
  case 0x1000007:
  case 0x1000008:
  case 0x1000009:
  case 0x100000a:
  case 0x100000b:
  case 0x100000c:
  case 0x100000d:
  case 0x100000e:
  case 0x100000f:
  case 0x1000012:
  case 0x1000014:
switchD_0043f001_caseD_1000006:
    cVar4 = QKeyEvent::matches((StandardKey)event);
    if (cVar4 != '\0') {
      selectAll(this);
      event[0xc] = (QKeyEvent)0x1;
      goto LAB_0043f39d;
    }
    break;
  case 0x1000010:
  case 0x1000011:
    uVar9 = QKeyEvent::modifiers();
    if ((uVar9 >> 0x19 & 1) != 0) {
      iVar6 = QLineEdit::cursorPosition(this_00->edit);
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      _event_1 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QLineEdit::displayText((QString *)&event_1,this_00->edit);
      if (*(int *)(event + 0x40) == 0x1000011) {
        if (((iVar6 != 0) || ((this_00->prefix).d.size == 0)) &&
           (lVar2 = (this_00->suffix).d.size, (long)iVar6 < (long)&DAT_aaaaaaaaaaaaaaaa - lVar2)) {
          this_01 = this_00->edit;
          iVar8 = -0x55555556 - ((int)lVar2 + iVar6);
LAB_0043f31e:
          QLineEdit::setSelection(this_01,iVar6,iVar8);
          event[0xc] = (QKeyEvent)0x1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&event_1);
          goto LAB_0043f39d;
        }
      }
      else if ((((undefined1 *)(long)iVar6 != &DAT_aaaaaaaaaaaaaaaa) ||
               ((this_00->suffix).d.size == 0)) && (lVar2 = (this_00->prefix).d.size, lVar2 < iVar6)
              ) {
        this_01 = this_00->edit;
        iVar8 = (int)lVar2 - iVar6;
        goto LAB_0043f31e;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&event_1);
    }
    break;
  case 0x1000013:
  case 0x1000015:
    iVar8 = 1;
    event[0xc] = (QKeyEvent)0x1;
    bVar3 = false;
LAB_0043f130:
    up = iVar6 == 0x1000013;
    goto LAB_0043f139;
  case 0x1000016:
  case 0x1000017:
    event[0xc] = (QKeyEvent)0x1;
    bVar3 = true;
    iVar8 = 10;
    up = true;
    if (iVar6 != 0x1000016) goto LAB_0043f130;
LAB_0043f139:
    uVar9 = (**(code **)(*(long *)this + 0x1c8))(this);
    if ((uVar9 & 2 - up) != 0) {
      if (!bVar3) {
        KVar7 = QKeyEvent::modifiers();
        if ((this_00->stepModifier & KVar7) != NoModifier) {
          iVar8 = iVar8 * 10;
        }
      }
      iVar6 = -iVar8;
      if (up != false) {
        iVar6 = iVar8;
      }
      pQVar10 = QWidget::style((QWidget *)this);
      iVar8 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x2a,0,this,0);
      if (iVar8 != 0) {
        this_00->buttonState = (uint)(up ^ 1) * 0x10 + 0x11;
      }
      if ((this_00->spinClickTimer).m_id == Invalid) {
        (**(code **)(*(long *)this + 0x1b0))(this,iVar6);
      }
      if (((!bVar3 && *(short *)(event + 0x50) < 0) &&
          ((this_00->spinClickThresholdTimer).m_id == Invalid)) &&
         ((this_00->spinClickTimer).m_id == Invalid)) {
        QAbstractSpinBoxPrivate::updateState(this_00,up,true);
      }
      _event_1 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QAccessibleValueChangeEvent::QAccessibleValueChangeEvent
                (&event_1,(QObject *)this,&this_00->value);
      QAccessible::updateAccessibility((QAccessibleEvent *)&event_1);
      QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent(&event_1);
    }
    goto LAB_0043f39d;
  default:
    if (iVar6 != 0x55) goto switchD_0043f001_caseD_1000006;
    uVar9 = QKeyEvent::modifiers();
    if ((uVar9 >> 0x1a & 1) != 0) {
      QGuiApplication::platformName();
      local_88.m_size = 3;
      local_88.m_data = "xcb";
      bVar3 = ::operator==((QString *)&event_1,&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&event_1);
      if (bVar3) {
        event[0xc] = (QKeyEvent)0x1;
        if ((*(byte *)(*(long *)(this + 8) + 0x3d0) & 2) == 0) {
          (**(code **)(*(long *)this + 0x1b8))(this);
        }
        goto LAB_0043f39d;
      }
    }
  }
  (**(code **)(*(long *)&this_00->edit->super_QWidget + 0x28))(this_00->edit,event);
  QLineEdit::text((QString *)&event_1,this_00->edit);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&event_1);
  if (local_68 != (undefined1 *)0x0) {
    this_00->field_0x3d0 = this_00->field_0x3d0 & 0x7f;
  }
  if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) == 0) {
    this_00->field_0x3d1 = this_00->field_0x3d1 | 1;
  }
LAB_0043f39d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSpinBox::keyPressEvent(QKeyEvent *event)
{
    Q_D(QAbstractSpinBox);

    d->keyboardModifiers = event->modifiers();

    if (!event->text().isEmpty() && d->edit->cursorPosition() < d->prefix.size())
        d->edit->setCursorPosition(d->prefix.size());

    int steps = 1;
    bool isPgUpOrDown = false;
    switch (event->key()) {
    case Qt::Key_PageUp:
    case Qt::Key_PageDown:
        steps *= 10;
        isPgUpOrDown = true;
        Q_FALLTHROUGH();
    case Qt::Key_Up:
    case Qt::Key_Down: {
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            // Reserve up/down for nav - use left/right for edit.
            if (!hasEditFocus() && (event->key() == Qt::Key_Up
                                    || event->key() == Qt::Key_Down)) {
                event->ignore();
                return;
            }
        }
#endif
        event->accept();
        const bool up = (event->key() == Qt::Key_PageUp || event->key() == Qt::Key_Up);
        if (!(stepEnabled() & (up ? StepUpEnabled : StepDownEnabled)))
            return;
        if (!isPgUpOrDown && (event->modifiers() & d->stepModifier))
            steps *= 10;
        if (!up)
            steps *= -1;
        if (style()->styleHint(QStyle::SH_SpinBox_AnimateButton, nullptr, this)) {
            d->buttonState = (Keyboard | (up ? Up : Down));
        }
        if (!d->spinClickTimer.isActive())
            stepBy(steps);
        if (event->isAutoRepeat() && !isPgUpOrDown) {
            if (!d->spinClickThresholdTimer.isActive() && !d->spinClickTimer.isActive()) {
                d->updateState(up, true);
            }
        }
#if QT_CONFIG(accessibility)
        QAccessibleValueChangeEvent event(this, d->value);
        QAccessible::updateAccessibility(&event);
#endif
        return;
    }
#ifdef QT_KEYPAD_NAVIGATION
    case Qt::Key_Left:
    case Qt::Key_Right:
        if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
            event->ignore();
            return;
        }
        break;
    case Qt::Key_Back:
        if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
            event->ignore();
            return;
        }
        break;
#endif
    case Qt::Key_Enter:
    case Qt::Key_Return:
        d->edit->d_func()->control->clearUndo();
        d->interpret(d->keyboardTracking ? AlwaysEmit : EmitIfChanged);
        selectAll();
        event->ignore();
        emit editingFinished();
        emit returnPressed();
        emit d->edit->returnPressed();
        return;

#ifdef QT_KEYPAD_NAVIGATION
    case Qt::Key_Select:
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            // Toggles between left/right moving cursor and inc/dec.
            setEditFocus(!hasEditFocus());
        }
        return;
#endif

    case Qt::Key_U:
        if (event->modifiers() & Qt::ControlModifier
            && QGuiApplication::platformName() == "xcb"_L1) { // only X11
            event->accept();
            if (!isReadOnly())
                clear();
            return;
        }
        break;

    case Qt::Key_End:
    case Qt::Key_Home:
        if (event->modifiers() & Qt::ShiftModifier) {
            int currentPos = d->edit->cursorPosition();
            const QString text = d->edit->displayText();
            if (event->key() == Qt::Key_End) {
                if ((currentPos == 0 && !d->prefix.isEmpty()) || text.size() - d->suffix.size() <= currentPos) {
                    break; // let lineedit handle this
                } else {
                    d->edit->setSelection(currentPos, text.size() - d->suffix.size() - currentPos);
                }
            } else {
                if ((currentPos == text.size() && !d->suffix.isEmpty()) || currentPos <= d->prefix.size()) {
                    break; // let lineedit handle this
                } else {
                    d->edit->setSelection(currentPos, d->prefix.size() - currentPos);
                }
            }
            event->accept();
            return;
        }
        break;

    default:
#ifndef QT_NO_SHORTCUT
        if (event == QKeySequence::SelectAll) {
            selectAll();
            event->accept();
            return;
        }
#endif
        break;
    }

    d->edit->event(event);
    if (!d->edit->text().isEmpty())
        d->cleared = false;
    if (!isVisible())
        d->ignoreUpdateEdit = true;
}